

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignOperator.cpp
# Opt level: O3

void __thiscall lts2::SignOperator::Apply(SignOperator *this,Mat *X,Mat *Ax)

{
  float fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 local_38;
  long *local_30 [2];
  long local_20 [2];
  
  if (((*(uint *)X & 0xfff) == 5) && (*(long *)(X + 0x10) != 0)) {
    local_38 = CONCAT44((int)**(undefined8 **)(X + 0x40),
                        (int)((ulong)**(undefined8 **)(X + 0x40) >> 0x20));
    cv::Mat::create(Ax,&local_38,5);
    iVar2 = *(int *)(Ax + 8);
    if (0 < (long)iVar2) {
      lVar7 = *(long *)(X + 0x10);
      lVar4 = **(long **)(X + 0x48);
      lVar8 = *(long *)(Ax + 0x10);
      lVar5 = **(long **)(Ax + 0x48);
      iVar3 = *(int *)(Ax + 0xc);
      lVar9 = 0;
      do {
        if (0 < iVar3) {
          lVar10 = 0;
          do {
            fVar1 = *(float *)(lVar7 + lVar10 * 4);
            uVar11 = 0xbf800000;
            if (-1e-06 <= fVar1) {
              uVar11 = 0;
            }
            uVar12 = 0x3f800000;
            if (fVar1 <= 1e-06) {
              uVar12 = uVar11;
            }
            *(undefined4 *)(lVar8 + lVar10 * 4) = uVar12;
            lVar10 = lVar10 + 1;
          } while (iVar3 != (int)lVar10);
        }
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + lVar5;
        lVar7 = lVar7 + lVar4;
      } while (lVar9 != iVar2);
    }
    return;
  }
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_30,"X.type() == CV_32F && X.data","");
  uVar6 = cv::error(-0xd7,(string *)local_30,"Apply",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/SignOperator.cpp"
                    ,0x2f);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

void lts2::SignOperator::Apply(cv::Mat const &X, cv::Mat &Ax)
{
  CV_Assert(X.type() == CV_32F && X.data);

  Ax.create(X.size(), X.type());

#ifdef WITH_DISPATCH
  dispatch_queue_t queue = dispatch_get_global_queue(DISPATCH_QUEUE_PRIORITY_HIGH, 0);
  dispatch_apply(Ax.rows, queue,
                 ^(size_t y) {
                   float const *p_x = X.ptr<float>(y);
                   float *p_ax = Ax.ptr<float>(y);

                   for (int x = 0; x < Ax.cols; ++x, ++p_x, ++p_ax)
                   {
                     if (*p_x > MY_EPSILON) *p_ax = 1.0;
                     else if (*p_x < -MY_EPSILON) *p_ax = -1.0;
                     else *p_ax = 0.0;
                   }
                 });
#else
  for (int y = 0; y < Ax.rows; ++y)
  {
    float const *p_x = X.ptr<float>(y);
    float *p_ax = Ax.ptr<float>(y);

    for (int x = 0; x < Ax.cols; ++x, ++p_x, ++p_ax)
    {
      if (*p_x > MY_EPSILON) *p_ax = 1.0;
      else if (*p_x < -MY_EPSILON) *p_ax = -1.0;
      else *p_ax = 0.0;
    }
  }
#endif
}